

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O2

bool __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
move_next(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
          *this)

{
  node *pnVar1;
  ulong uVar2;
  
  if ((this->at_start_ == true) && (this->sequence_size != 0)) {
    move_to_pos(this,&this->current_node,&this->current_pos,0,this->sequence_size);
    pnVar1 = this->current_node;
    this->current_enumeration_node = pnVar1;
    this->current_enumeration_pos = 0;
  }
  else {
    if (this->current_enumeration_node != (node *)0x0) {
      uVar2 = this->current_enumeration_pos + 1;
      this->current_enumeration_pos = uVar2;
      if (uVar2 < this->sequence_size) {
        pnVar1 = this->current_enumeration_node->right;
        this->current_enumeration_node = pnVar1;
        goto LAB_002359e3;
      }
      this->current_enumeration_node = (node *)0x0;
    }
    pnVar1 = (node *)0x0;
  }
LAB_002359e3:
  this->at_start_ = false;
  return pnVar1 != (node *)0x0;
}

Assistant:

bool sequence_kernel_2<T,mem_manager>::
    move_next (
    ) const
    {
        if (at_start_ && sequence_size>0)
        {            
            move_to_pos(current_node,current_pos,0,sequence_size);            
            current_enumeration_node = current_node;
            current_enumeration_pos = 0;
        }
        else if (current_enumeration_node!=0)
        {
            ++current_enumeration_pos;
            if (current_enumeration_pos<sequence_size)
            {                
                current_enumeration_node = current_enumeration_node->right;
            }
            else
            {
                // we have reached the end of the sequence
                current_enumeration_node = 0;
            }
        }

        at_start_ = false;
        return (current_enumeration_node!=0);
    }